

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::__cxx11::string>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  anon_struct_8_0_00000001_for___align aVar1;
  vtable_type *pvVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer pSVar6;
  pointer pSVar7;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  double local_30;
  
  if (v == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_30 = t;
    get_value<std::__cxx11::string>(&local_58,this);
    bVar4 = local_58.has_value_;
    if (local_58.has_value_ == true) {
      uVar3 = (long)&local_58.contained + 0x10;
      if (local_58.contained.data.__align != (anon_struct_8_0_00000001_for___align)uVar3) {
        uVar3 = local_58.contained.data._0_8_;
      }
      local_58.contained.data._0_8_ = uVar3;
      ::std::__cxx11::string::_M_assign((string *)v);
    }
    if (((local_58.has_value_ & 1U) != 0) &&
       (local_58.contained.data.__align !=
        (anon_struct_8_0_00000001_for___align)((long)&local_58.contained + 0x10))) {
      operator_delete((void *)local_58.contained.data._0_8_,local_58.contained._16_8_ + 1);
    }
    if (bVar4 != false) {
      return true;
    }
    pSVar6 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = local_30;
    if (pSVar6 == pSVar7) {
      return false;
    }
  }
  else {
    pSVar6 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar7 != pSVar6) {
    bVar4 = tinyusdz::value::TimeSamples::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar4;
  }
  if (((this->_blocked != false) ||
      (pvVar2 = (this->_value).v_.vtable, pvVar2 == (vtable_type *)0x0)) ||
     ((uVar5 = (*pvVar2->type_id)(), uVar5 != 0 &&
      ((pvVar2 = (this->_value).v_.vtable, pvVar2 == (vtable_type *)0x0 ||
       (uVar5 = (*pvVar2->type_id)(), uVar5 != 1)))))) {
    get_value<std::__cxx11::string>(&local_58,this);
    bVar4 = local_58.has_value_;
    aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_58.contained + 0x10);
    if (local_58.has_value_ == true) {
      uVar3 = aVar1;
      if (local_58.contained.data.__align != aVar1) {
        uVar3 = local_58.contained.data._0_8_;
      }
      local_58.contained.data._0_8_ = uVar3;
      ::std::__cxx11::string::_M_assign((string *)v);
    }
    if (((local_58.has_value_ & 1U) != 0) && (local_58.contained.data.__align != aVar1)) {
      operator_delete((void *)local_58.contained.data._0_8_,local_58.contained._16_8_ + 1);
    }
    if (bVar4 != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }